

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

int polyscope::sizeInBytes(RenderDataType *r)

{
  RenderDataType *r_local;
  int local_4;
  
  switch(*r) {
  case Vector2Float:
    local_4 = 8;
    break;
  case Vector3Float:
    local_4 = 0xc;
    break;
  case Vector4Float:
    local_4 = 0x10;
    break;
  case Matrix44Float:
    local_4 = 0x40;
    break;
  case Float:
    local_4 = 4;
    break;
  case Int:
    local_4 = 4;
    break;
  case UInt:
    local_4 = 4;
    break;
  case Vector2UInt:
    local_4 = 8;
    break;
  case Vector3UInt:
    local_4 = 0xc;
    break;
  case Vector4UInt:
    local_4 = 0x10;
    break;
  default:
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int sizeInBytes(const RenderDataType& r) {
  switch (r) {
  case RenderDataType::Vector2Float:
    return 2 * 4;
  case RenderDataType::Vector3Float:
    return 3 * 4;
  case RenderDataType::Vector4Float:
    return 4 * 4;
  case RenderDataType::Matrix44Float:
    return 4 * 4 * 4;
  case RenderDataType::Float:
    return 4;
  case RenderDataType::Int:
    return 4;
  case RenderDataType::UInt:
    return 4;
  case RenderDataType::Vector2UInt:
    return 2 * 4;
  case RenderDataType::Vector3UInt:
    return 3 * 4;
  case RenderDataType::Vector4UInt:
    return 4 * 4;
  }
  return -1;
}